

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O1

void __thiscall
arangodb::velocypack::ObjectIterator::ObjectIterator
          (ObjectIterator *this,Slice slice,bool useSequentialIteration)

{
  ValueLength VVar1;
  uint8_t *puVar2;
  ulong uVar3;
  byte *pbStack_38;
  code *pcStack_20;
  uint8_t *local_18;
  
  (this->_slice)._start = slice._start;
  this->_current = (uint8_t *)0x0;
  this->_size = 0;
  this->_position = 0;
  local_18 = slice._start;
  if (SliceStaticData::TypeMap[*slice._start] == Object) {
    pcStack_20 = (code *)0x108a72;
    VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::objectLength
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_18);
    this->_size = VVar1;
    pcStack_20 = (code *)0x108a82;
    puVar2 = first(this,useSequentialIteration);
    this->_current = puVar2;
    return;
  }
  pcStack_20 = key;
  velocypack::ObjectIterator();
  if (this->_position != this->_size) {
    pcStack_20 = (code *)this->_current;
    if (pcStack_20 != (code *)0x0) {
      if (SUB81(slice._start,0) != false) {
        SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                  ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                   &pcStack_20);
      }
      return;
    }
    SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthKey
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this,
               this->_position,SUB81(slice._start,0));
    return;
  }
  key();
  if (this->_position != this->_size) {
    this->_position = this->_position + 1;
    pbStack_38 = this->_current;
    if (pbStack_38 != (byte *)0x0) {
      uVar3 = (ulong)"\x01\x01"[*pbStack_38];
      if (uVar3 == 0) {
        uVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &pbStack_38,pbStack_38);
      }
      puVar2 = this->_current;
      pbStack_38 = puVar2 + uVar3;
      this->_current = pbStack_38;
      uVar3 = (ulong)"\x01\x01"[puVar2[uVar3]];
      if (uVar3 == 0) {
        uVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &pbStack_38,pbStack_38);
      }
      this->_current = this->_current + uVar3;
    }
  }
  return;
}

Assistant:

explicit ObjectIterator(Slice slice, bool useSequentialIteration = false)
      : _slice{slice}, _current{nullptr}, _size{0}, _position{0} {
    auto const head = slice.head();
    if (VELOCYPACK_UNLIKELY(slice.type(head) != ValueType::Object)) {
      throw Exception{Exception::InvalidValueType, "Expecting Object slice"};
    }
    _size = slice.objectLength();
    _current = first(useSequentialIteration);
  }